

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::LoadLayerFromMemory
               (uint8_t *addr,size_t length,string *asset_name,Layer *layer,string *warn,string *err
               ,USDLoadOptions *options)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string basedir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  if (length < 0x58) {
    if (8 < length) {
LAB_00124bf1:
      if (addr[8] == '0' && *(long *)addr == 0x2e31206164737523) {
        bVar1 = LoadUSDALayerFromMemory(addr,length,asset_name,layer,warn,err,options);
        goto LAB_00124c69;
      }
    }
    IsUSDZ(addr,length);
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if (*(long *)addr != 0x434453552d525850) goto LAB_00124bf1;
    bVar1 = LoadUSDCLayerFromMemory(addr,length,asset_name,layer,warn,err,options);
LAB_00124c69:
    if (bVar1 != false) {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      io::GetBaseDir(&local_38,(string *)asset_name);
      p_Var2 = (layer->_prim_specs)._M_h._M_before_begin._M_nxt;
      if (p_Var2 != (_Hash_node_base *)0x0) {
        do {
          PropagateAssetResolverState(0,(PrimSpec *)(p_Var2 + 5),(string *)&local_38,&local_58);
          p_Var2 = p_Var2->_M_nxt;
        } while (p_Var2 != (_Hash_node_base *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      return true;
    }
  }
  return false;
}

Assistant:

bool LoadLayerFromMemory(const uint8_t *addr, const size_t length,
                       const std::string &asset_name, Layer *layer,
                       std::string *warn, std::string *err,
                       const USDLoadOptions &options) {

  bool ret{false};

  if (IsUSDC(addr, length)) {
    DCOUT("Detected as USDC.");
#if 1
    ret = LoadUSDCLayerFromMemory(addr, length, asset_name, layer, warn, err,
                              options);
#else
    if (err) {
      (*err) += "TODO: Load USDC as Layer is not implemented yet.\n";
    }
    return false;
#endif
  } else if (IsUSDA(addr, length)) {
    DCOUT("Detected as USDA.");
    ret = LoadUSDALayerFromMemory(addr, length, asset_name, layer, warn, err,
                              options);
  } else if (IsUSDZ(addr, length)) {
    DCOUT("Detected as USDZ.");
#if 0
    return LoadUSDZLayerFromMemory(addr, length, asset_name, layer, warn, err,
                              options);
#else
    if (err) {
      (*err) += "TODO: Load USDZ as Layer is not implemented yet.\n";
    }
    return false;
#endif
  } else {
    if (err) {
      (*err) += "Couldn't determine USD format(USDA/USDC/USDZ).\n";
    }
    return false;
  }

  if (ret) {
    std::vector<std::string> search_paths; // empty
    std::string basedir = io::GetBaseDir(asset_name);
    // Save current working path to each PrimSpec in the layer
    // for the subsequent composition operation.
    for (auto &root_ps : layer->primspecs()) {
      PropagateAssetResolverState(0, root_ps.second, basedir, search_paths);
    }
  }

  return ret;
}